

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O3

void printKVData(ktx_uint8_t *pKvd,ktx_uint32_t kvdLen)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  _Bool _Var4;
  ktx_error_code_e kVar5;
  int iVar6;
  ktxHashList This;
  ulong uVar7;
  uint8_t *puVar8;
  uint uVar9;
  char *pcVar10;
  size_t __size;
  char *pcVar11;
  ulong uVar12;
  bool bVar13;
  ktx_uint32_t valueLen;
  ktxHashList kvDataHead;
  char *value;
  char *key;
  ktx_uint32_t keyLen;
  uint local_58;
  uint local_54;
  ktxHashList local_50;
  uint *local_48;
  char *local_40;
  uint local_34;
  
  local_50 = (ktxHashListEntry *)0x0;
  if ((pKvd == (ktx_uint8_t *)0x0) || (kvdLen == 0)) {
    __assert_fail("pKvd != NULL && kvdLen > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/info.c"
                  ,0x8b,"void printKVData(ktx_uint8_t *, ktx_uint32_t)");
  }
  kVar5 = ktxHashList_Deserialize(&local_50,kvdLen,pKvd);
  if (kVar5 == KTX_SUCCESS) {
    if (local_50 != (ktxHashListEntry *)0x0) {
      This = local_50;
      uVar9 = 0;
      do {
        ktxHashListEntry_GetKey(This,&local_34,&local_40);
        ktxHashListEntry_GetValue(This,&local_58,&local_48);
        fprintf(_stdout,"%s:",local_40);
        pcVar10 = local_40;
        pcVar11 = (char *)local_48;
        if (local_48 == (uint *)0x0) {
          __size = 6;
          pcVar11 = " null\n";
LAB_001cdfbb:
          fwrite(pcVar11,__size,1,_stdout);
        }
        else {
          iVar6 = strcmp(local_40,"KTXglFormat");
          if (iVar6 == 0) {
            if (local_58 == 0xc) {
              uVar3 = *(uint *)pcVar11;
              uVar2 = *(uint *)((long)pcVar11 + 4);
              local_54 = *(uint *)((long)pcVar11 + 8);
              fputc(10,_stdout);
              fprintf(_stdout,"    glInternalformat: 0x%08X\n",(ulong)uVar3);
              fprintf(_stdout,"    glFormat: 0x%08X\n",(ulong)uVar2);
              pcVar10 = "    glType: 0x%08X\n";
              uVar3 = local_54;
LAB_001ce02e:
              fprintf(_stdout,pcVar10,(ulong)uVar3);
            }
          }
          else {
            iVar6 = strcmp(pcVar10,"KTXanimData");
            if (iVar6 == 0) {
              if (local_58 == 0xc) {
                uVar3 = *(uint *)pcVar11;
                local_54 = *(uint *)((long)pcVar11 + 4);
                uVar2 = *(uint *)((long)pcVar11 + 8);
                fputc(10,_stdout);
                fprintf(_stdout,"    duration: %u\n",(ulong)uVar3);
                fprintf(_stdout,"    timescale: %u\n",(ulong)local_54);
                pcVar11 = (char *)"";
                if (uVar2 == 0) {
                  pcVar11 = " (infinite)";
                }
                fprintf(_stdout,"    loopCount: %u%s\n",(ulong)uVar2,pcVar11);
              }
            }
            else {
              iVar6 = strcmp(pcVar10,"KTXcubemapIncomplete");
              if (iVar6 == 0) {
                if (local_58 == 1) {
                  uVar3 = *(uint *)pcVar11;
                  fputc(10,_stdout);
                  pcVar11 = "true";
                  if ((uVar3 & 1) == 0) {
                    pcVar11 = "false";
                  }
                  fprintf(_stdout,"    positiveX: %s\n",pcVar11);
                  pcVar11 = "true";
                  if ((uVar3 & 2) == 0) {
                    pcVar11 = "false";
                  }
                  fprintf(_stdout,"    negativeX: %s\n",pcVar11);
                  pcVar11 = "true";
                  if ((uVar3 & 4) == 0) {
                    pcVar11 = "false";
                  }
                  fprintf(_stdout,"    positiveY: %s\n",pcVar11);
                  pcVar11 = "true";
                  if ((uVar3 & 8) == 0) {
                    pcVar11 = "false";
                  }
                  fprintf(_stdout,"    negativeY: %s\n",pcVar11);
                  pcVar11 = "true";
                  if ((uVar3 & 0x10) == 0) {
                    pcVar11 = "false";
                  }
                  fprintf(_stdout,"    positiveZ: %s\n",pcVar11);
                  pcVar11 = "true";
                  if ((uVar3 & 0x20) == 0) {
                    pcVar11 = "false";
                  }
                  pcVar10 = "    negativeZ: %s\n";
LAB_001ce1e1:
                  fprintf(_stdout,pcVar10,pcVar11);
                }
              }
              else {
                _Var4 = isKnownKeyValueUINT32(pcVar10);
                if (_Var4) {
                  if (local_58 == 4) {
                    pcVar10 = " %u\n";
                    uVar3 = *(uint *)pcVar11;
                    goto LAB_001ce02e;
                  }
                }
                else {
                  _Var4 = isKnownKeyValueString(pcVar10);
                  if (!_Var4) {
                    fwrite(" [",2,1,_stdout);
                    uVar7 = (ulong)local_58;
                    if (local_58 != 0) {
                      uVar12 = 0;
                      do {
                        pbVar1 = (byte *)((long)local_48 + uVar12);
                        uVar12 = uVar12 + 1;
                        puVar8 = (uint8_t *)", ";
                        if (uVar12 == uVar7) {
                          puVar8 = "";
                        }
                        fprintf(_stdout,"%d%s",(ulong)(uint)(int)(char)*pbVar1,puVar8);
                        uVar7 = (ulong)local_58;
                      } while (uVar12 < uVar7);
                    }
                    __size = 2;
                    pcVar11 = "]\n";
                    goto LAB_001cdfbb;
                  }
                  if (*(byte *)((long)pcVar11 + (ulong)(local_58 - 1)) == 0) {
                    pcVar10 = " %s\n";
                    goto LAB_001ce1e1;
                  }
                }
              }
            }
          }
        }
        This = ktxHashList_Next(This);
      } while ((This != (ktxHashListEntry *)0x0) && (bVar13 = uVar9 < 99, uVar9 = uVar9 + 1, bVar13)
              );
      ktxHashList_Destruct(&local_50);
    }
  }
  else {
    fwrite("Failed to parse or not enough memory to build list of key/value pairs.\n",0x47,1,_stdout
          );
  }
  return;
}

Assistant:

void
printKVData(ktx_uint8_t* pKvd, ktx_uint32_t kvdLen)
{
    KTX_error_code result;
    ktxHashList kvDataHead = 0;

    assert(pKvd != NULL && kvdLen > 0);

    result = ktxHashList_Deserialize(&kvDataHead, kvdLen, pKvd);
    if (result != KTX_SUCCESS) {
        fprintf(stdout, "Failed to parse or not enough memory to build list of key/value pairs.\n");
        return;
    }

    if (kvDataHead == NULL)
        return;

    int entryIndex = 0;
    ktxHashListEntry* entry = kvDataHead;
    for (; entry != NULL && entryIndex < MAX_NUM_KVD_ENTRIES; entry = ktxHashList_Next(entry), ++entryIndex) {
        char* key;
        char* value;
        ktx_uint32_t keyLen, valueLen;

        ktxHashListEntry_GetKey(entry, &keyLen, &key);
        ktxHashListEntry_GetValue(entry, &valueLen, (void**)&value);
        // Keys must be NUL terminated.
        fprintf(stdout, "%s:", key);
        if (!value) {
            fprintf(stdout, " null\n");

        } else {
            if (strcmp(key, "KTXglFormat") == 0) {
                if (valueLen == 3 * sizeof(ktx_uint32_t)) {
                    ktx_uint32_t glInternalformat = *(const ktx_uint32_t*) (value + 0);
                    ktx_uint32_t glFormat = *(const ktx_uint32_t*) (value + 4);
                    ktx_uint32_t glType = *(const ktx_uint32_t*) (value + 8);
                    fprintf(stdout, "\n");
                    fprintf(stdout, "    glInternalformat: 0x%08X\n", glInternalformat);
                    fprintf(stdout, "    glFormat: 0x%08X\n", glFormat);
                    fprintf(stdout, "    glType: 0x%08X\n", glType);
                }

            } else if (strcmp(key, "KTXanimData") == 0) {
                if (valueLen == 3 * sizeof(ktx_uint32_t)) {
                    ktx_uint32_t duration = *(const ktx_uint32_t*) (value + 0);
                    ktx_uint32_t timescale = *(const ktx_uint32_t*) (value + 4);
                    ktx_uint32_t loopCount = *(const ktx_uint32_t*) (value + 8);
                    fprintf(stdout, "\n");
                    fprintf(stdout, "    duration: %u\n", duration);
                    fprintf(stdout, "    timescale: %u\n", timescale);
                    fprintf(stdout, "    loopCount: %u%s\n", loopCount, loopCount == 0 ? " (infinite)" : "");
                }

            } else if (strcmp(key, "KTXcubemapIncomplete") == 0) {
                if (valueLen == sizeof(ktx_uint8_t)) {
                    ktx_uint8_t faces = *value;
                    fprintf(stdout, "\n");
                    fprintf(stdout, "    positiveX: %s\n", faces & 1u << 0u ? "true" : "false");
                    fprintf(stdout, "    negativeX: %s\n", faces & 1u << 1u ? "true" : "false");
                    fprintf(stdout, "    positiveY: %s\n", faces & 1u << 2u ? "true" : "false");
                    fprintf(stdout, "    negativeY: %s\n", faces & 1u << 3u ? "true" : "false");
                    fprintf(stdout, "    positiveZ: %s\n", faces & 1u << 4u ? "true" : "false");
                    fprintf(stdout, "    negativeZ: %s\n", faces & 1u << 5u ? "true" : "false");
                }

            } else if (isKnownKeyValueUINT32(key)) {
                if (valueLen == sizeof(ktx_uint32_t)) {
                    ktx_uint32_t number = *(const ktx_uint32_t*) value;
                    fprintf(stdout, " %u\n", number);
                }

            } else if (isKnownKeyValueString(key)) {
                if (value[valueLen-1] == '\0') {
                    fprintf(stdout, " %s\n", value);
                }

            } else {
                fprintf(stdout, " [");
                for (ktx_uint32_t i = 0; i < valueLen; i++)
                    fprintf(stdout, "%d%s", (int) value[i], i + 1 == valueLen ? "" : ", ");
                fprintf(stdout, "]\n");
            }
        }
    }

    ktxHashList_Destruct(&kvDataHead);
}